

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGuiTextFilter::ImGuiTextRange::split
          (ImGuiTextRange *this,char separator,ImVector<ImGuiTextFilter::ImGuiTextRange> *out)

{
  int *piVar1;
  int iVar2;
  ImGuiTextRange *pIVar3;
  ImGuiTextRange *pIVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  
  iVar2 = out->Capacity;
  if (iVar2 < 0) {
    uVar5 = iVar2 / 2 + iVar2;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(uVar8 << 4,GImAllocatorUserData);
    if (out->Data != (ImGuiTextRange *)0x0) {
      memcpy(pIVar4,out->Data,(long)out->Size << 4);
      pIVar3 = out->Data;
      if ((pIVar3 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    out->Data = pIVar4;
    out->Capacity = (int)uVar8;
  }
  out->Size = 0;
  pcVar9 = this->b;
  pcVar10 = pcVar9;
  if (pcVar9 < this->e) {
    do {
      if (*pcVar9 == separator) {
        iVar2 = out->Capacity;
        if (out->Size == iVar2) {
          if (iVar2 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar2 / 2 + iVar2;
          }
          iVar7 = out->Size + 1;
          if (iVar7 < iVar6) {
            iVar7 = iVar6;
          }
          if (iVar2 < iVar7) {
            if (GImGui != (ImGuiContext_conflict1 *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            pIVar4 = (ImGuiTextRange *)
                     (*GImAllocatorAllocFunc)((long)iVar7 << 4,GImAllocatorUserData);
            if (out->Data != (ImGuiTextRange *)0x0) {
              memcpy(pIVar4,out->Data,(long)out->Size << 4);
              pIVar3 = out->Data;
              if ((pIVar3 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
            }
            out->Data = pIVar4;
            out->Capacity = iVar7;
          }
        }
        pIVar4 = out->Data;
        iVar2 = out->Size;
        pIVar4[iVar2].b = pcVar10;
        pIVar4[iVar2].e = pcVar9;
        out->Size = out->Size + 1;
        pcVar10 = pcVar9 + 1;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < this->e);
  }
  if (pcVar10 != pcVar9) {
    iVar2 = out->Capacity;
    if (out->Size == iVar2) {
      iVar6 = out->Size + 1;
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext_conflict1 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
        if (out->Data != (ImGuiTextRange *)0x0) {
          memcpy(pIVar4,out->Data,(long)out->Size << 4);
          pIVar3 = out->Data;
          if ((pIVar3 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        out->Data = pIVar4;
        out->Capacity = iVar6;
      }
    }
    pIVar4 = out->Data;
    iVar2 = out->Size;
    pIVar4[iVar2].b = pcVar10;
    pIVar4[iVar2].e = pcVar9;
    out->Size = out->Size + 1;
  }
  return;
}

Assistant:

void ImGuiTextFilter::ImGuiTextRange::split(char separator, ImVector<ImGuiTextRange>* out) const
{
    out->resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out->push_back(ImGuiTextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out->push_back(ImGuiTextRange(wb, we));
}